

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O0

undefined8 SoapySDRDeviceProbe_abi_cxx11_(Device *device)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  reference ppVar5;
  ulong uVar6;
  Device *device_00;
  ulong uVar7;
  long *in_RSI;
  char *pcVar8;
  undefined8 in_RDI;
  size_t chan_1;
  size_t chan;
  string uarts;
  string gpios;
  string settings;
  string registers;
  size_t in_stack_00000288;
  int in_stack_00000294;
  Device *in_stack_00000298;
  string sensors;
  string timeSources;
  string clockSources;
  size_t numTxChans;
  size_t numRxChans;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it;
  iterator __end1;
  iterator __begin1;
  Kwargs *__range1;
  stringstream ss;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa30;
  vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *in_stack_fffffffffffffa40;
  string local_468 [32];
  Device *local_448;
  string local_440 [32];
  ulong local_420;
  undefined1 local_418 [24];
  string local_400 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc18;
  undefined1 local_3e0 [24];
  string local_3c8 [16];
  ArgInfoList *in_stack_fffffffffffffc48;
  undefined1 local_3a8 [24];
  string local_390 [32];
  undefined1 local_370 [24];
  string local_358 [32];
  string local_338 [32];
  undefined1 local_318 [24];
  string local_300 [32];
  undefined1 local_2e0 [24];
  string local_2c8 [32];
  undefined1 local_2a8 [24];
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  _Self local_230;
  _Self local_228;
  undefined1 local_220 [48];
  undefined1 *local_1f0;
  string local_1e8 [32];
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [376];
  long *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_188,"----------------------------------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_188,"-- Device identification");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_188,"----------------------------------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_188,"  driver=");
  (**(code **)(*local_10 + 0x10))(local_1c8);
  poVar4 = std::operator<<(poVar4,local_1c8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1c8);
  poVar4 = std::operator<<(local_188,"  hardware=");
  (**(code **)(*local_10 + 0x18))(local_1e8);
  poVar4 = std::operator<<(poVar4,local_1e8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1e8);
  (**(code **)(*local_10 + 0x20))(local_220);
  local_1f0 = local_220;
  local_228._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_fffffffffffffa28);
  local_230._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffa28);
  while( true ) {
    bVar2 = std::operator!=(&local_228,&local_230);
    if (!bVar2) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x10ff21);
    poVar4 = std::operator<<(local_188,"  ");
    poVar4 = std::operator<<(poVar4,(string *)ppVar5);
    poVar4 = std::operator<<(poVar4,"=");
    poVar4 = std::operator<<(poVar4,(string *)&ppVar5->second);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(in_stack_fffffffffffffa30);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x10feaa);
  std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_188,"----------------------------------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_188,"-- Peripheral summary");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_188,"----------------------------------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar6 = (**(code **)(*local_10 + 0x38))(local_10,1);
  device_00 = (Device *)(**(code **)(*local_10 + 0x38))(local_10,0);
  poVar4 = std::operator<<(local_188,"  Channels: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar6);
  poVar4 = std::operator<<(poVar4," Rx, ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)device_00);
  poVar4 = std::operator<<(poVar4," Tx");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_188,"  Timestamps: ");
  plVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"",&local_269);
  bVar3 = (**(code **)(*plVar1 + 0x298))(plVar1,local_268);
  pcVar8 = "NO";
  if ((bVar3 & 1) != 0) {
    pcVar8 = "YES";
  }
  poVar4 = std::operator<<(poVar4,pcVar8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  (**(code **)(*local_10 + 0x268))(local_2a8);
  toString<std::__cxx11::string>(in_stack_fffffffffffffc18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa40);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    poVar4 = std::operator<<(local_188,"  Clock sources: ");
    poVar4 = std::operator<<(poVar4,local_290);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  (**(code **)(*local_10 + 0x280))(local_2e0);
  toString<std::__cxx11::string>(in_stack_fffffffffffffc18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa40);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    poVar4 = std::operator<<(local_188,"  Time sources: ");
    poVar4 = std::operator<<(poVar4,local_2c8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  (**(code **)(*local_10 + 0x2b8))(local_318);
  toString<std::__cxx11::string>(in_stack_fffffffffffffc18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa40);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    poVar4 = std::operator<<(local_188,"  Sensors: ");
    poVar4 = std::operator<<(poVar4,local_300);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  sensorReadings_abi_cxx11_(device_00);
  std::operator<<(local_188,local_338);
  std::__cxx11::string::~string(local_338);
  (**(code **)(*local_10 + 0x2e8))(local_370);
  toString<std::__cxx11::string>(in_stack_fffffffffffffc18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa40);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    poVar4 = std::operator<<(local_188,"  Registers: ");
    poVar4 = std::operator<<(poVar4,local_358);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  (**(code **)(*local_10 + 800))(local_3a8);
  toString_abi_cxx11_(in_stack_fffffffffffffc48);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            (in_stack_fffffffffffffa40);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    poVar4 = std::operator<<(local_188,"  Other Settings:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar4,local_390);
  }
  (**(code **)(*local_10 + 0x360))(local_3e0);
  toString<std::__cxx11::string>(in_stack_fffffffffffffc18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa40);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    poVar4 = std::operator<<(local_188,"  GPIOs: ");
    poVar4 = std::operator<<(poVar4,local_3c8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  (**(code **)(*local_10 + 0x3b0))(local_418);
  toString<std::__cxx11::string>(in_stack_fffffffffffffc18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa40);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    poVar4 = std::operator<<(local_188,"  UARTs: ");
    poVar4 = std::operator<<(poVar4,local_400);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  for (local_420 = 0; local_420 < uVar6; local_420 = local_420 + 1) {
    probeChannel_abi_cxx11_(in_stack_00000298,in_stack_00000294,in_stack_00000288);
    std::operator<<(local_188,local_440);
    std::__cxx11::string::~string(local_440);
  }
  for (local_448 = (Device *)0x0; local_448 < device_00; local_448 = local_448 + 1) {
    poVar4 = local_188;
    probeChannel_abi_cxx11_(in_stack_00000298,in_stack_00000294,in_stack_00000288);
    std::operator<<(poVar4,local_468);
    std::__cxx11::string::~string(local_468);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_400);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::string::~string(local_390);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string SoapySDRDeviceProbe(SoapySDR::Device *device)
{
    std::stringstream ss;

    /*******************************************************************
     * Identification info
     ******************************************************************/
    ss << std::endl;
    ss << "----------------------------------------------------" << std::endl;
    ss << "-- Device identification" << std::endl;
    ss << "----------------------------------------------------" << std::endl;

    ss << "  driver=" << device->getDriverKey() << std::endl;
    ss << "  hardware=" << device->getHardwareKey() << std::endl;
    for (const auto &it : device->getHardwareInfo())
    {
        ss << "  " << it.first << "=" << it.second << std::endl;
    }

    /*******************************************************************
     * Available peripherals
     ******************************************************************/
    ss << std::endl;
    ss << "----------------------------------------------------" << std::endl;
    ss << "-- Peripheral summary" << std::endl;
    ss << "----------------------------------------------------" << std::endl;

    size_t numRxChans = device->getNumChannels(SOAPY_SDR_RX);
    size_t numTxChans = device->getNumChannels(SOAPY_SDR_TX);
    ss << "  Channels: " << numRxChans << " Rx, " << numTxChans << " Tx" << std::endl;

    ss << "  Timestamps: " << (device->hasHardwareTime()?"YES":"NO") << std::endl;

    std::string clockSources = toString(device->listClockSources());
    if (not clockSources.empty()) ss << "  Clock sources: " << clockSources << std::endl;

    std::string timeSources = toString(device->listTimeSources());
    if (not timeSources.empty()) ss << "  Time sources: " << timeSources << std::endl;

    std::string sensors = toString(device->listSensors());
    if (not sensors.empty()) ss << "  Sensors: " << sensors << std::endl;
    ss << sensorReadings(device);

    std::string registers = toString(device->listRegisterInterfaces());
    if (not registers.empty()) ss << "  Registers: " << registers << std::endl;

    std::string settings = toString(device->getSettingInfo());
    if (not settings.empty()) ss << "  Other Settings:" << std::endl << settings;

    std::string gpios = toString(device->listGPIOBanks());
    if (not gpios.empty()) ss << "  GPIOs: " << gpios << std::endl;

    std::string uarts = toString(device->listUARTs());
    if (not uarts.empty()) ss << "  UARTs: " << uarts << std::endl;

    /*******************************************************************
     * Per-channel info
     ******************************************************************/
    for (size_t chan = 0; chan < numRxChans; chan++)
    {
        ss << probeChannel(device, SOAPY_SDR_RX, chan);
    }
    for (size_t chan = 0; chan < numTxChans; chan++)
    {
        ss << probeChannel(device, SOAPY_SDR_TX, chan);
    }

    return ss.str();
}